

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *host_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImGuiWindow *pIVar5;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 in_stack_ffffffffffffffe0;
  
  pIVar2 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) == 0)) {
    if ((pIVar5->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      EndColumns();
    }
    if ((pIVar5->Flags & 0x20000000U) == 0) {
      PopClipRect();
    }
    if ((pIVar5->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    if (((pIVar5->DockNode != (ImGuiDockNode *)0x0) && (((byte)pIVar5->field_0x43a >> 1 & 1) != 0))
       && (pIVar1 = pIVar5->DockNode->HostWindow, pIVar1 != (ImGuiWindow *)0x0)) {
      in_stack_ffffffffffffffd8 = ::operator+(in_stack_ffffffffffffffc8,(ImVec2 *)0x1b4230);
      in_stack_ffffffffffffffe0 = ::operator-(in_stack_ffffffffffffffc8,(ImVec2 *)0x1b4249);
      (pIVar1->DC).CursorMaxPos = in_stack_ffffffffffffffe0;
    }
    ImVector<ImGuiWindow_*>::pop_back(&pIVar2->CurrentWindowStack);
    if ((pIVar5->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back(&pIVar2->BeginPopupStack);
    }
    ErrorCheckBeginEndCompareStacksSize(pIVar5,false);
    bVar3 = ImVector<ImGuiWindow_*>::empty(&pIVar2->CurrentWindowStack);
    if (bVar3) {
      pIVar5 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar4 = ImVector<ImGuiWindow_*>::back(&pIVar2->CurrentWindowStack);
      pIVar5 = *ppIVar4;
    }
    SetCurrentWindow(pIVar5);
    if (pIVar2->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport((ImGuiWindow *)in_stack_ffffffffffffffe0,
                         (ImGuiViewportP *)in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}